

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::insert(Value *this,ArrayIndex index,Value *newValue)

{
  ValueType VVar1;
  Value *pVVar2;
  Value *this_00;
  uint local_1d8;
  ArrayIndex i;
  ArrayIndex length;
  ostringstream local_1a0 [8];
  OStringStream oss;
  Value *newValue_local;
  ArrayIndex index_local;
  Value *this_local;
  
  VVar1 = type(this);
  if ((VVar1 != nullValue) && (VVar1 = type(this), VVar1 != arrayValue)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"in Json::Value::insert: requires arrayValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((String *)&i);
  }
  local_1d8 = size(this);
  if (local_1d8 < index) {
    this_local._7_1_ = false;
  }
  else {
    for (; index < local_1d8; local_1d8 = local_1d8 - 1) {
      pVVar2 = operator[](this,local_1d8 - 1);
      this_00 = operator[](this,local_1d8);
      operator=(this_00,pVVar2);
    }
    pVVar2 = operator[](this,index);
    operator=(pVVar2,newValue);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::insert(ArrayIndex index, Value&& newValue) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::insert: requires arrayValue");
  ArrayIndex length = size();
  if (index > length) {
    return false;
  }
  for (ArrayIndex i = length; i > index; i--) {
    (*this)[i] = std::move((*this)[i - 1]);
  }
  (*this)[index] = std::move(newValue);
  return true;
}